

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddQuadOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,uint32_t operand1,uint32_t operand2,
          uint32_t operand3,uint32_t operand4)

{
  IRContext *pIVar1;
  uint32_t res_id;
  Instruction *pIVar2;
  long lVar3;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  size_type __dnew;
  string message;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_1b0;
  undefined1 local_1a8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_188;
  undefined1 local_180 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_160;
  undefined1 local_158 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_138;
  undefined1 local_130 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_110;
  size_t *local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined4 local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  undefined4 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined4 local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (type_id == 0) {
    res_id = 0;
LAB_00222ecc:
    pIVar2 = (Instruction *)operator_new(0x70);
    pIVar1 = this->context_;
    local_1a8._24_8_ = local_1a8 + 0x10;
    local_1a8._0_8_ = &PTR__SmallVector_003d7c78;
    local_188._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_1a8._16_4_ = operand1;
    local_1a8._8_8_ = 1;
    local_108 = (size_t *)CONCAT44(local_108._4_4_,1);
    local_100._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
    local_100.size_ = 0;
    local_100.small_data_ = (uint *)local_100.buffer;
    local_100.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_100,(SmallVector<unsigned_int,_2UL> *)local_1a8);
    local_130._24_8_ = local_130 + 0x10;
    local_130._0_8_ = &PTR__SmallVector_003d7c78;
    local_110._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_130._8_8_ = 1;
    local_d8 = 1;
    local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
    local_d0.size_ = 0;
    local_d0.small_data_ = (uint *)local_d0.buffer;
    local_d0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_130._16_4_ = operand2;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_130);
    local_158._24_8_ = local_158 + 0x10;
    local_158._0_8_ = &PTR__SmallVector_003d7c78;
    local_138._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_158._8_8_ = 1;
    local_a8 = 1;
    local_a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
    local_a0.size_ = 0;
    local_a0.small_data_ = (uint *)local_a0.buffer;
    local_a0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_158._16_4_ = operand3;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_a0,(SmallVector<unsigned_int,_2UL> *)local_158);
    local_180._24_8_ = local_180 + 0x10;
    local_180._0_8_ = &PTR__SmallVector_003d7c78;
    local_160._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_180._16_4_ = operand4;
    local_180._8_8_ = 1;
    local_78 = 1;
    local_70._0_8_ = &PTR__SmallVector_003d7c78;
    local_70._8_8_ = 0;
    local_70._24_8_ = local_70 + 0x10;
    this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_50
    ;
    local_50._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_70,
               (SmallVector<unsigned_int,_2UL> *)local_180);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               &local_108,&local_48);
    Instruction::Instruction(pIVar2,pIVar1,opcode,type_id,res_id,(OperandList *)&local_48);
    local_1b0._M_head_impl = pIVar2;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    lVar3 = -0xc0;
    do {
      *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_003d7c78;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
      }
      *(undefined8 *)this_00 = 0;
      this_00 = this_00 + -0x30;
      lVar3 = lVar3 + 0x30;
    } while (lVar3 != 0);
    local_180._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_160._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_160,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_160._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_158._0_8_ = &PTR__SmallVector_003d7c78;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_138._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_138,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_138._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_130._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_110._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_110,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_110._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_1a8._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_188._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_188,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_188._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    pIVar2 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                  *)&local_1b0);
    if (local_1b0._M_head_impl != (Instruction *)0x0) {
      (*((local_1b0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  else {
    pIVar1 = this->context_;
    res_id = Module::TakeNextIdBound
                       ((pIVar1->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)
       ) {
      local_1a8._0_8_ = (_func_int **)0x25;
      local_108 = &local_100.size_;
      local_108 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)local_1a8);
      local_100.size_ = local_1a8._0_8_;
      *local_108 = 0x667265766f204449;
      local_108[1] = 0x797254202e776f6c;
      local_108[2] = 0x676e696e6e757220;
      local_108[3] = 0x746361706d6f6320;
      builtin_strncpy((char *)((long)local_108 + 0x1d),"act-ids.",8);
      local_100._vptr_SmallVector = (_func_int **)local_1a8._0_8_;
      *(char *)((long)local_108 + local_1a8._0_8_) = '\0';
      local_1a8._0_8_ = (_func_int **)0x0;
      local_1a8._8_8_ = 0;
      local_1a8._16_4_ = (array<signed_char,_4UL>)0x0;
      local_1a8._20_4_ = (array<signed_char,_4UL>)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_1a8,(char *)local_108
                  );
      if (local_108 != &local_100.size_) {
        operator_delete(local_108,local_100.size_ + 1);
      }
    }
    else if (res_id != 0) goto LAB_00222ecc;
    pIVar2 = (Instruction *)0x0;
  }
  return pIVar2;
}

Assistant:

Instruction* AddQuadOp(uint32_t type_id, spv::Op opcode, uint32_t operand1,
                         uint32_t operand2, uint32_t operand3,
                         uint32_t operand4) {
    uint32_t result_id = 0;
    if (type_id != 0) {
      result_id = GetContext()->TakeNextId();
      if (result_id == 0) {
        return nullptr;
      }
    }
    std::unique_ptr<Instruction> newQuadOp(new Instruction(
        GetContext(), opcode, type_id, result_id,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand1}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand2}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand3}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand4}}}));
    return AddInstruction(std::move(newQuadOp));
  }